

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomString::write(DomString *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    local_40.ptr = L"string";
    local_40.size = 6;
  }
  else {
    QString::toLower_helper((QString *)&local_40);
  }
  QVar3.m_size = (size_t)local_40.ptr;
  QVar3.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (this->m_has_attr_notr == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"notr",4);
    QVar9.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    local_70.d = (this->m_attr_notr).d.d;
    local_70.ptr = (this->m_attr_notr).d.ptr;
    local_70.size = (this->m_attr_notr).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar4.m_size = (size_t)local_40.ptr;
    QVar4.field_0.m_data = aVar2.m_data;
    QVar9.m_size = (size_t)local_70.ptr;
    QXmlStreamWriter::writeAttribute(QVar4,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (this->m_has_attr_comment == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"comment",7);
    QVar10.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    local_70.d = (this->m_attr_comment).d.d;
    local_70.ptr = (this->m_attr_comment).d.ptr;
    local_70.size = (this->m_attr_comment).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar5.m_size = (size_t)local_40.ptr;
    QVar5.field_0.m_data = aVar2.m_data;
    QVar10.m_size = (size_t)local_70.ptr;
    QXmlStreamWriter::writeAttribute(QVar5,QVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (this->m_has_attr_extraComment == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"extracomment",0xc);
    QVar11.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    local_70.d = (this->m_attr_extraComment).d.d;
    local_70.ptr = (this->m_attr_extraComment).d.ptr;
    local_70.size = (this->m_attr_extraComment).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar6.m_size = (size_t)local_40.ptr;
    QVar6.field_0.m_data = aVar2.m_data;
    QVar11.m_size = (size_t)local_70.ptr;
    QXmlStreamWriter::writeAttribute(QVar6,QVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if (this->m_has_attr_id == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_40,L"id",2);
    QVar12.field_0.m_data = (void *)(local_40.size | 0x8000000000000000);
    local_70.d = (this->m_attr_id).d.d;
    local_70.ptr = (this->m_attr_id).d.ptr;
    local_70.size = (this->m_attr_id).d.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar7.m_size = (size_t)local_40.ptr;
    QVar7.field_0.m_data = aVar2.m_data;
    QVar12.m_size = (size_t)local_70.ptr;
    QXmlStreamWriter::writeAttribute(QVar7,QVar12);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  if ((this->m_text).d.size != 0) {
    QVar8.m_size = (size_t)(this->m_text).d.ptr;
    QVar8.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeCharacters(QVar8);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomString::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("string") : tagName.toLower());

    if (hasAttributeNotr())
        writer.writeAttribute(u"notr"_s, attributeNotr());

    if (hasAttributeComment())
        writer.writeAttribute(u"comment"_s, attributeComment());

    if (hasAttributeExtraComment())
        writer.writeAttribute(u"extracomment"_s, attributeExtraComment());

    if (hasAttributeId())
        writer.writeAttribute(u"id"_s, attributeId());

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}